

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splaygetbest(timeval i,Curl_tree *t,Curl_tree **removed)

{
  Curl_tree *pCVar1;
  timeval i_00;
  uint local_44;
  uint local_40;
  uint local_3c;
  Curl_tree *x;
  Curl_tree **removed_local;
  Curl_tree *t_local;
  timeval i_local;
  
  if (t == (Curl_tree *)0x0) {
    *removed = (Curl_tree *)0x0;
    i_local.tv_usec = 0;
  }
  else {
    i_00.tv_usec = Curl_splaygetbest::tv_zero.tv_usec;
    i_00.tv_sec = Curl_splaygetbest::tv_zero.tv_sec;
    pCVar1 = Curl_splay(i_00,t);
    if (i.tv_sec < (pCVar1->key).tv_sec) {
      local_3c = 0xffffffff;
    }
    else {
      if ((pCVar1->key).tv_sec < i.tv_sec) {
        local_40 = 1;
      }
      else {
        if (i.tv_usec < (pCVar1->key).tv_usec) {
          local_44 = 0xffffffff;
        }
        else {
          local_44 = (uint)((pCVar1->key).tv_usec < i.tv_usec);
        }
        local_40 = local_44;
      }
      local_3c = local_40;
    }
    if ((int)local_3c < 0) {
      *removed = (Curl_tree *)0x0;
      i_local.tv_usec = (__suseconds_t)pCVar1;
    }
    else {
      i_local.tv_usec = (__suseconds_t)pCVar1->samen;
      if ((Curl_tree *)i_local.tv_usec == pCVar1) {
        i_local.tv_usec = (__suseconds_t)pCVar1->larger;
        *removed = pCVar1;
      }
      else {
        (((Curl_tree *)i_local.tv_usec)->key).tv_sec = (pCVar1->key).tv_sec;
        (((Curl_tree *)i_local.tv_usec)->key).tv_usec = (pCVar1->key).tv_usec;
        ((Curl_tree *)i_local.tv_usec)->larger = pCVar1->larger;
        ((Curl_tree *)i_local.tv_usec)->smaller = pCVar1->smaller;
        ((Curl_tree *)i_local.tv_usec)->samep = pCVar1->samep;
        pCVar1->samep->samen = (Curl_tree *)i_local.tv_usec;
        *removed = pCVar1;
      }
    }
  }
  return (Curl_tree *)i_local.tv_usec;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct timeval i,
                                       struct Curl_tree *t,
                                       struct Curl_tree **removed)
{
  static struct timeval tv_zero = {0, 0};
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  /* find smallest */
  t = Curl_splay(tv_zero, t);
  if(compare(i, t->key) < 0) {
    /* even the smallest is too big */
    *removed = NULL;
    return t;
  }

  /* FIRST! Check if there is a list with identical keys */
  x = t->samen;
  if(x != t) {
    /* there is, pick one from the list */

    /* 'x' is the new root node */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;

    *removed = t;
    return x; /* new root */
  }

  /* we splayed the tree to the smallest element, there is no smaller */
  x = t->larger;
  *removed = t;

  return x;
}